

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O1

void sha256_transform(SHA256_CTX *ctx,BYTE *data)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  int aiStack_178 [9];
  int local_154 [5];
  uint local_140 [68];
  
  lVar9 = 0;
  do {
    uVar1 = *(uint *)(data + lVar9 * 4);
    local_140[lVar9 + 2] =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x10);
  lVar9 = 0x10;
  do {
    uVar1 = local_140[lVar9];
    iVar14 = aiStack_178[lVar9 + 1];
    local_140[lVar9 + 2] =
         aiStack_178[lVar9] + local_154[lVar9] +
         ((int)uVar1 >> 10 ^ (uVar1 << 0xd | (int)uVar1 >> 0x13) ^
         (uVar1 << 0xf | (int)uVar1 >> 0x11)) +
         (iVar14 >> 3 ^ (iVar14 << 0xe | iVar14 >> 0x12) ^ (iVar14 << 0x19 | iVar14 >> 7));
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x40);
  uVar1 = ctx->state[1];
  uVar2 = ctx->state[2];
  uVar3 = ctx->state[3];
  uVar4 = ctx->state[4];
  uVar5 = ctx->state[5];
  uVar6 = ctx->state[6];
  uVar7 = ctx->state[7];
  lVar9 = 0;
  uVar18 = ctx->state[0];
  uVar17 = uVar1;
  uVar8 = uVar2;
  uVar16 = uVar3;
  uVar11 = uVar4;
  uVar10 = uVar5;
  uVar19 = uVar6;
  uVar12 = uVar7;
  do {
    uVar13 = uVar19;
    uVar19 = uVar10;
    uVar10 = uVar11;
    uVar15 = uVar8;
    uVar8 = uVar17;
    uVar17 = uVar18;
    iVar14 = ((uVar19 ^ uVar13) & uVar10 ^ uVar13) + uVar12 +
             ((uVar10 << 7 | (int)uVar10 >> 0x19) ^
             (uVar10 << 0x15 | (int)uVar10 >> 0xb) ^ (uVar10 << 0x1a | (int)uVar10 >> 6)) +
             *(int *)((long)k + lVar9) + *(int *)((long)local_140 + lVar9 + 8);
    uVar11 = uVar16 + iVar14;
    uVar18 = (uVar8 & uVar15 ^ (uVar8 ^ uVar15) & uVar17) +
             ((uVar17 << 10 | (int)uVar17 >> 0x16) ^
             (uVar17 << 0x13 | (int)uVar17 >> 0xd) ^ (uVar17 << 0x1e | (int)uVar17 >> 2)) + iVar14;
    lVar9 = lVar9 + 4;
    uVar16 = uVar15;
    uVar12 = uVar13;
  } while (lVar9 != 0x100);
  ctx->state[0] = uVar18 + ctx->state[0];
  ctx->state[1] = uVar17 + uVar1;
  ctx->state[2] = uVar8 + uVar2;
  ctx->state[3] = uVar15 + uVar3;
  ctx->state[4] = uVar11 + uVar4;
  ctx->state[5] = uVar10 + uVar5;
  ctx->state[6] = uVar19 + uVar6;
  ctx->state[7] = uVar13 + uVar7;
  return;
}

Assistant:

static inline void sha256_transform(SHA256_CTX *ctx, const BYTE data[])
{
    WORD a, b, c, d, e, f, g, h, i, j, t1, t2, m[64];

    for (i = 0, j = 0; i < 16; ++i, j += 4)
        m[i] = (data[j] << 24) | (data[j + 1] << 16) | (data[j + 2] << 8) | (data[j + 3]);
    for ( ; i < 64; ++i)
        m[i] = SIG1(m[i - 2]) + m[i - 7] + SIG0(m[i - 15]) + m[i - 16];

    a = ctx->state[0];
    b = ctx->state[1];
    c = ctx->state[2];
    d = ctx->state[3];
    e = ctx->state[4];
    f = ctx->state[5];
    g = ctx->state[6];
    h = ctx->state[7];

    for (i = 0; i < 64; ++i) {
        t1 = h + EP1(e) + CH(e,f,g) + k[i] + m[i];
        t2 = EP0(a) + MAJ(a,b,c);
        h = g;
        g = f;
        f = e;
        e = d + t1;
        d = c;
        c = b;
        b = a;
        a = t1 + t2;
    }

    ctx->state[0] += a;
    ctx->state[1] += b;
    ctx->state[2] += c;
    ctx->state[3] += d;
    ctx->state[4] += e;
    ctx->state[5] += f;
    ctx->state[6] += g;
    ctx->state[7] += h;
}